

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_invoke(Executor *this,Worker *worker,Node *node)

{
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  char *pcVar5;
  pointer pSVar6;
  iterator piVar7;
  size_type sVar8;
  reference ppNVar9;
  __int_type_conflict _Var10;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  U __s;
  long *local_250;
  uint uStack_1ec;
  size_type local_198;
  size_t i;
  Node *s;
  int cond;
  iterator __end3;
  iterator __begin3;
  SmallVector<int,_2U> *__range3;
  Node *cache;
  atomic<unsigned_long> *j;
  undefined1 local_130 [8];
  SmallVector<int,_2U> conds;
  undefined1 local_100 [8];
  SmallVector<tf::Node_*,_2U> nodes;
  Node *node_local;
  Worker *worker_local;
  Executor *this_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  nodes.Storage.InlineElts[0] = (U  [1])(U  [1])node;
  do {
    puVar4 = (uint *)((long)nodes.Storage.InlineElts[0] + 0xd0);
    __s = (U)0xffff;
    std::operator&(acquire,__memory_order_mask);
  } while ((*puVar4 & 8) == 0);
  do {
    bVar2 = Node::_is_cancelled((Node *)nodes.Storage.InlineElts[0]);
    if (bVar2) {
      _cancel_invoke(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      return;
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)((long)nodes.Storage.InlineElts[0] + 0xe0));
    if (bVar2) {
      pSVar6 = std::unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>::
               operator->((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                           *)((long)nodes.Storage.InlineElts[0] + 0xe0));
      bVar2 = SmallVectorBase::empty((SmallVectorBase *)pSVar6);
      if (!bVar2) {
        SmallVector<tf::Node_*,_2U>::SmallVector((SmallVector<tf::Node_*,_2U> *)local_100);
        bVar2 = Node::_acquire_all((Node *)nodes.Storage.InlineElts[0],
                                   (SmallVector<tf::Node_*,_2U> *)local_100);
        if (bVar2) {
          puVar4 = (uint *)((long)nodes.Storage.InlineElts[0] + 0xd0);
          uStack_1ec = *puVar4;
          do {
            LOCK();
            uVar3 = *puVar4;
            bVar2 = uStack_1ec == uVar3;
            if (bVar2) {
              *puVar4 = uStack_1ec | 4;
              uVar3 = uStack_1ec;
            }
            UNLOCK();
            uStack_1ec = uVar3;
          } while (!bVar2);
          __s = (U)0x4;
          conds._24_4_ = 0;
        }
        else {
          __s = (U)worker;
          _schedule(this,worker,(SmallVector<tf::Node_*,_2U> *)local_100);
          conds._24_4_ = 1;
        }
        SmallVector<tf::Node_*,_2U>::~SmallVector((SmallVector<tf::Node_*,_2U> *)local_100);
        if (conds._24_4_ != 0) {
          return;
        }
      }
    }
    SmallVector<int,_2U>::SmallVector((SmallVector<int,_2U> *)local_130);
    pcVar5 = std::
             variant<std::monostate,_tf::Node::Static,_tf::Node::Dynamic,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::SilentAsync,_tf::Node::cudaFlow,_tf::Node::syclFlow,_tf::Node::Runtime>
             ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Dynamic,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::SilentAsync,_tf::Node::cudaFlow,_tf::Node::syclFlow,_tf::Node::Runtime>
                      *)((long)nodes.Storage.InlineElts[0] + 0x30),(char *)__s,__c);
    switch(pcVar5) {
    case (char *)0x1:
      _invoke_static_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      break;
    case (char *)0x2:
      _invoke_dynamic_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      break;
    case (char *)0x3:
      _invoke_condition_task
                (this,worker,(Node *)nodes.Storage.InlineElts[0],(SmallVector<int,_2U> *)local_130);
      break;
    case (char *)0x4:
      _invoke_multi_condition_task
                (this,worker,(Node *)nodes.Storage.InlineElts[0],(SmallVector<int,_2U> *)local_130);
      break;
    case (char *)0x5:
      _invoke_module_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      break;
    case (char *)0x6:
      _invoke_async_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      __s = (U)nodes.Storage;
      _tear_down_async(this,(Node *)nodes.Storage.InlineElts[0]);
      conds._24_4_ = 1;
      goto LAB_001a4ba9;
    case (char *)0x7:
      _invoke_silent_async_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      __s = (U)nodes.Storage;
      _tear_down_async(this,(Node *)nodes.Storage.InlineElts[0]);
      conds._24_4_ = 1;
      goto LAB_001a4ba9;
    case (char *)0x8:
      _invoke_cudaflow_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      break;
    case (char *)0x9:
      _invoke_syclflow_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
      break;
    case (char *)0xa:
      _invoke_runtime_task(this,worker,(Node *)nodes.Storage.InlineElts[0]);
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)((long)nodes.Storage.InlineElts[0] + 0xe0));
    if (bVar2) {
      pSVar6 = std::unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>::
               operator->((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                           *)((long)nodes.Storage.InlineElts[0] + 0xe0));
      bVar2 = SmallVectorBase::empty((SmallVectorBase *)&pSVar6->to_release);
      if (!bVar2) {
        Node::_release_all((SmallVector<tf::Node_*,_2U> *)&j,(Node *)nodes.Storage.InlineElts[0]);
        _schedule(this,worker,(SmallVector<tf::Node_*,_2U> *)&j);
        SmallVector<tf::Node_*,_2U>::~SmallVector((SmallVector<tf::Node_*,_2U> *)&j);
      }
    }
    puVar4 = (uint *)((long)nodes.Storage.InlineElts[0] + 0xd0);
    std::operator&(relaxed,__memory_order_mask);
    if ((*puVar4 & 1) == 0) {
      pcVar5 = (char *)Node::num_dependents((Node *)nodes.Storage.InlineElts[0]);
      std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)((long)nodes.Storage.InlineElts[0] + 0xd8),
                 (__int_type_conflict)pcVar5);
      iVar11 = extraout_EDX_00;
    }
    else {
      pcVar5 = (char *)Node::num_strong_dependents((Node *)nodes.Storage.InlineElts[0]);
      std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)((long)nodes.Storage.InlineElts[0] + 0xd8),
                 (__int_type_conflict)pcVar5);
      iVar11 = extraout_EDX;
    }
    if (*(long *)((long)nodes.Storage.InlineElts[0] + 200) == 0) {
      local_250 = (long *)(*(long *)((long)nodes.Storage.InlineElts[0] + 0xc0) + 0x90);
    }
    else {
      local_250 = (long *)(*(long *)((long)nodes.Storage.InlineElts[0] + 200) + 0xd8);
    }
    __range3 = (SmallVector<int,_2U> *)0x0;
    pcVar5 = std::
             variant<std::monostate,_tf::Node::Static,_tf::Node::Dynamic,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::SilentAsync,_tf::Node::cudaFlow,_tf::Node::syclFlow,_tf::Node::Runtime>
             ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Dynamic,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::SilentAsync,_tf::Node::cudaFlow,_tf::Node::syclFlow,_tf::Node::Runtime>
                      *)((long)nodes.Storage.InlineElts[0] + 0x30),pcVar5,iVar11);
    if (&DAT_00000001 < pcVar5 + -3) {
      for (local_198 = 0;
          sVar8 = SmallVectorTemplateCommon<tf::Node_*,_void>::size
                            ((SmallVectorTemplateCommon<tf::Node_*,_void> *)
                             ((long)nodes.Storage.InlineElts[0] + 0x70)), local_198 < sVar8;
          local_198 = local_198 + 1) {
        ppNVar9 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                            ((SmallVectorTemplateCommon<tf::Node_*,_void> *)
                             ((long)nodes.Storage.InlineElts[0] + 0x70),local_198);
        _Var10 = std::__atomic_base<unsigned_long>::operator--
                           (&((*ppNVar9)->_join_counter).super___atomic_base<unsigned_long>);
        if (_Var10 == 0) {
          LOCK();
          *local_250 = *local_250 + 1;
          UNLOCK();
          if (__range3 != (SmallVector<int,_2U> *)0x0) {
            _schedule(this,worker,(Node *)__range3);
          }
          ppNVar9 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                              ((SmallVectorTemplateCommon<tf::Node_*,_void> *)
                               ((long)nodes.Storage.InlineElts[0] + 0x70),local_198);
          __range3 = (SmallVector<int,_2U> *)*ppNVar9;
        }
      }
    }
    else {
      __end3 = SmallVectorTemplateCommon<int,_void>::begin
                         ((SmallVectorTemplateCommon<int,_void> *)local_130);
      piVar7 = SmallVectorTemplateCommon<int,_void>::end
                         ((SmallVectorTemplateCommon<int,_void> *)local_130);
      for (; __end3 != piVar7; __end3 = __end3 + 1) {
        iVar11 = *__end3;
        pNVar1 = (Node *)__range3;
        if ((-1 < iVar11) &&
           (sVar8 = SmallVectorTemplateCommon<tf::Node_*,_void>::size
                              ((SmallVectorTemplateCommon<tf::Node_*,_void> *)
                               ((long)nodes.Storage.InlineElts[0] + 0x70)),
           (ulong)(long)iVar11 < sVar8)) {
          ppNVar9 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                              ((SmallVectorTemplateCommon<tf::Node_*,_void> *)
                               ((long)nodes.Storage.InlineElts[0] + 0x70),(long)iVar11);
          pNVar1 = *ppNVar9;
          std::operator&(relaxed,__memory_order_mask);
          (pNVar1->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
          LOCK();
          *local_250 = *local_250 + 1;
          UNLOCK();
          if (__range3 != (SmallVector<int,_2U> *)0x0) {
            _schedule(this,worker,(Node *)__range3);
          }
        }
        __range3 = (SmallVector<int,_2U> *)pNVar1;
      }
    }
    __s = (U)worker;
    _tear_down_invoke(this,worker,(Node *)nodes.Storage.InlineElts[0]);
    if (__range3 == (SmallVector<int,_2U> *)0x0) {
      conds._24_4_ = 0;
    }
    else {
      nodes.Storage.InlineElts[0] = (U  [1])(U  [1])__range3;
      conds._24_4_ = 4;
    }
LAB_001a4ba9:
    SmallVector<int,_2U>::~SmallVector((SmallVector<int,_2U> *)local_130);
    if ((uint)conds._24_4_ < 2) {
      return;
    }
  } while( true );
}

Assistant:

inline void Executor::_invoke(Worker& worker, Node* node) {

  // synchronize all outstanding memory operations caused by reordering
  while(!(node->_state.load(std::memory_order_acquire) & Node::READY));

  begin_invoke:

  // no need to do other things if the topology is cancelled
  if(node->_is_cancelled()) {
    _cancel_invoke(worker, node);
    return;
  }

  // if acquiring semaphore(s) exists, acquire them first
  if(node->_semaphores && !node->_semaphores->to_acquire.empty()) {
    SmallVector<Node*> nodes;
    if(!node->_acquire_all(nodes)) {
      _schedule(worker, nodes);
      return;
    }
    node->_state.fetch_or(Node::ACQUIRED, std::memory_order_release);
  }

  // condition task
  //int cond = -1;
  SmallVector<int> conds;

  // switch is faster than nested if-else due to jump table
  switch(node->_handle.index()) {
    // static task
    case Node::STATIC:{
      _invoke_static_task(worker, node);
    }
    break;

    // dynamic task
    case Node::DYNAMIC: {
      _invoke_dynamic_task(worker, node);
    }
    break;

    // condition task
    case Node::CONDITION: {
      _invoke_condition_task(worker, node, conds);
    }
    break;

    // multi-condition task
    case Node::MULTI_CONDITION: {
      _invoke_multi_condition_task(worker, node, conds);
    }
    break;

    // module task
    case Node::MODULE: {
      _invoke_module_task(worker, node);
    }
    break;

    // async task
    case Node::ASYNC: {
      _invoke_async_task(worker, node);
      _tear_down_async(node);
      return ;
    }
    break;

    // silent async task
    case Node::SILENT_ASYNC: {
      _invoke_silent_async_task(worker, node);
      _tear_down_async(node);
      return ;
    }
    break;

    // cudaflow task
    case Node::CUDAFLOW: {
      _invoke_cudaflow_task(worker, node);
    }
    break;

    // syclflow task
    case Node::SYCLFLOW: {
      _invoke_syclflow_task(worker, node);
    }
    break;

    // runtime task
    case Node::RUNTIME: {
      _invoke_runtime_task(worker, node);
    }
    break;

    // monostate (placeholder)
    default:
    break;
  }

  // if releasing semaphores exist, release them
  if(node->_semaphores && !node->_semaphores->to_release.empty()) {
    _schedule(worker, node->_release_all());
  }

  // We MUST recover the dependency since the graph may have cycles.
  // This must be done before scheduling the successors, otherwise this might cause
  // race condition on the _dependents
  if((node->_state.load(std::memory_order_relaxed) & Node::CONDITIONED)) {
    node->_join_counter = node->num_strong_dependents();
  }
  else {
    node->_join_counter = node->num_dependents();
  }

  // acquire the parent flow counter
  auto& j = (node->_parent) ? node->_parent->_join_counter :
                              node->_topology->_join_counter;

  Node* cache {nullptr};

  // At this point, the node storage might be destructed (to be verified)
  // case 1: non-condition task
  switch(node->_handle.index()) {

    // condition and multi-condition tasks
    case Node::CONDITION:
    case Node::MULTI_CONDITION: {
      for(auto cond : conds) {
        if(cond >= 0 && static_cast<size_t>(cond) < node->_successors.size()) {
          auto s = node->_successors[cond];
          // zeroing the join counter for invariant
          s->_join_counter.store(0, std::memory_order_relaxed);
          j.fetch_add(1);
          if(cache) {
            _schedule(worker, cache);
          }
          cache = s;
        }
      }
    }
    break;

    // non-condition task
    default: {
      for(size_t i=0; i<node->_successors.size(); ++i) {
        if(--(node->_successors[i]->_join_counter) == 0) {
          j.fetch_add(1);
          if(cache) {
            _schedule(worker, cache);
          }
          cache = node->_successors[i];
        }
      }
    }
    break;
  }

  // tear_down the invoke
  _tear_down_invoke(worker, node);

  // perform tail recursion elimination for the right-most child to reduce
  // the number of expensive pop/push operations through the task queue
  if(cache) {
    node = cache;
    //node->_state.fetch_or(Node::READY, std::memory_order_release);
    goto begin_invoke;
  }
}